

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v5::internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
               (char spec,float_spec_handler<char> *handler)

{
  float_spec_handler<char> *handler_local;
  char spec_local;
  
  if (spec != '\0') {
    if (spec == 'A') {
LAB_00164470:
      float_spec_handler<char>::on_hex(handler);
      return;
    }
    if (spec == 'E') {
LAB_0016445a:
      float_spec_handler<char>::on_exp(handler);
      return;
    }
    if (spec == 'F') {
LAB_00164465:
      float_spec_handler<char>::on_fixed(handler);
      return;
    }
    if (spec != 'G') {
      if (spec == 'a') goto LAB_00164470;
      if (spec == 'e') goto LAB_0016445a;
      if (spec == 'f') goto LAB_00164465;
      if (spec != 'g') {
        float_spec_handler<char>::on_error(handler);
        return;
      }
    }
  }
  float_spec_handler<char>::on_general(handler);
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(Char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}